

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::pushSource(Preprocessor *this,string_view source,string_view name)

{
  string_view name_00;
  SourceBuffer buffer_00;
  string_view text;
  bool bVar1;
  SourceBuffer buffer;
  char *in_stack_000000d8;
  SourceLocation in_stack_000000e0;
  BufferID buffer_01;
  Preprocessor *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SourceManager *in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  SourceLocation local_60 [3];
  undefined8 local_48;
  uint64_t local_40;
  SourceLocation *local_38;
  uint32_t uStack_2c;
  basic_string_view<char,_std::char_traits<char>_> local_20 [2];
  
  SourceLocation::SourceLocation(local_60);
  text._M_str = in_stack_ffffffffffffff90;
  text._M_len = in_stack_ffffffffffffff88;
  SourceManager::assignText
            (in_stack_ffffffffffffff78,text,in_stack_ffffffffffffff80,
             (SourceLibrary *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  buffer_00.data._M_len._4_4_ = in_stack_ffffffffffffff74;
  buffer_00.data._M_len._0_4_ = in_stack_ffffffffffffff70;
  buffer_00.data._M_str = (char *)in_stack_ffffffffffffff78;
  buffer_00.library = (SourceLibrary *)local_48;
  buffer_00._24_8_ = local_40;
  buffer_01.id = uStack_2c;
  pushSource(in_stack_ffffffffffffff60,buffer_00);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_20);
  if (!bVar1) {
    SourceLocation::SourceLocation(local_38,buffer_01,local_40);
    name_00._M_str = in_stack_000000d8;
    name_00._M_len = (size_t)source._M_str;
    SourceManager::addLineDirective
              ((SourceManager *)source._M_len,in_stack_000000e0,(size_t)name._M_str,name_00,
               name._M_len._7_1_);
  }
  return;
}

Assistant:

void Preprocessor::pushSource(std::string_view source, std::string_view name) {
    auto buffer = sourceManager.assignText(source);
    pushSource(buffer);

    if (!name.empty())
        sourceManager.addLineDirective(SourceLocation(buffer.id, 0), 2, name, 0);
}